

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChHexahedronFace.h
# Opt level: O2

void __thiscall
chrono::fea::ChHexahedronFace::LoadableStateIncrement
          (ChHexahedronFace *this,uint off_x,ChState *x_new,ChState *x,uint off_v,ChStateDelta *Dv)

{
  int iVar1;
  ChLoadableUV local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  for (iVar1 = 0; iVar1 != 4; iVar1 = iVar1 + 1) {
    GetNodeN((ChHexahedronFace *)&local_40,(int)this);
    (**(code **)(*(long *)local_40 + 0xa8))(local_40,off_x,x_new,x,off_v,Dv);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    off_v = off_v + 3;
    off_x = off_x + 3;
  }
  return;
}

Assistant:

virtual void LoadableStateIncrement(const unsigned int off_x,
                                        ChState& x_new,
                                        const ChState& x,
                                        const unsigned int off_v,
                                        const ChStateDelta& Dv) override {
        for (int i = 0; i < 4; ++i) {
            GetNodeN(i)->NodeIntStateIncrement(off_x + i * 3, x_new, x, off_v + i * 3, Dv);
        }
    }